

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

mg_local_date_time * mg_local_date_time_make(int64_t seconds,int64_t nanoseconds)

{
  mg_local_date_time *pmVar1;
  
  pmVar1 = (mg_local_date_time *)mg_allocator_malloc(&mg_system_allocator,0x10);
  if (pmVar1 == (mg_local_date_time *)0x0) {
    pmVar1 = (mg_local_date_time *)0x0;
  }
  else {
    pmVar1->seconds = seconds;
    pmVar1->nanoseconds = nanoseconds;
  }
  return pmVar1;
}

Assistant:

mg_local_date_time *mg_local_date_time_make(int64_t seconds,
                                            int64_t nanoseconds) {
  mg_local_date_time *ldt = mg_local_date_time_alloc(&mg_system_allocator);
  if (!ldt) {
    return NULL;
  }
  ldt->seconds = seconds;
  ldt->nanoseconds = nanoseconds;
  return ldt;
}